

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status fdb_iterator_seek_to_min(fdb_iterator *iterator)

{
  fdb_status fVar1;
  
  if ((iterator != (fdb_iterator *)0x0) && (iterator->handle != (fdb_kvs_handle *)0x0)) {
    if (iterator->hbtrie_iterator != (hbtrie_iterator *)0x0) {
      fVar1 = _fdb_iterator_seek_to_min_key(iterator);
      return fVar1;
    }
    fVar1 = fdb_iterator_seek_byseq(iterator,(iterator->field_10).start_seqnum,'\0');
    return fVar1;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_to_min(fdb_iterator *iterator) {
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status ret;
    LATENCY_STAT_START();

    if (!iterator->hbtrie_iterator) {
        ret = _fdb_iterator_seek_to_min_seq(iterator);
    } else {
        ret = _fdb_iterator_seek_to_min_key(iterator);
    }
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEEK_MIN);
    return ret;
}